

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error
SW_FT_Stroker_GetBorderCounts
          (SW_FT_Stroker stroker,SW_FT_StrokerBorder border,SW_FT_UInt *anum_points,
          SW_FT_UInt *anum_contours)

{
  SW_FT_Error SVar1;
  SW_FT_UInt num_contours;
  SW_FT_UInt num_points;
  
  _num_contours = 0;
  if ((int)border < 2 && stroker != (SW_FT_Stroker)0x0) {
    ft_stroke_border_get_counts(stroker->borders + (int)border,&num_points,&num_contours);
    SVar1 = 0;
  }
  else {
    SVar1 = -1;
  }
  if (anum_points != (SW_FT_UInt *)0x0) {
    *anum_points = num_points;
  }
  if (anum_contours != (SW_FT_UInt *)0x0) {
    *anum_contours = num_contours;
  }
  return SVar1;
}

Assistant:

SW_FT_Error SW_FT_Stroker_GetBorderCounts(SW_FT_Stroker       stroker,
                                          SW_FT_StrokerBorder border,
                                          SW_FT_UInt*         anum_points,
                                          SW_FT_UInt*         anum_contours)
{
    SW_FT_UInt  num_points = 0, num_contours = 0;
    SW_FT_Error error;

    if (!stroker || border > 1) {
        error = -1;  // SW_FT_THROW( Invalid_Argument );
        goto Exit;
    }

    error = ft_stroke_border_get_counts(stroker->borders + border, &num_points,
                                        &num_contours);
Exit:
    if (anum_points) *anum_points = num_points;

    if (anum_contours) *anum_contours = num_contours;

    return error;
}